

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktComputeBasicComputeShaderTests.cpp
# Opt level: O2

void __thiscall
vkt::compute::anon_unknown_0::SSBOLocalBarrierTest::initPrograms
          (SSBOLocalBarrierTest *this,SourceCollections *sourceCollections)

{
  int iVar1;
  int iVar2;
  ostream *poVar3;
  ProgramSources *this_00;
  ostringstream src;
  allocator<char> local_211;
  string local_210;
  string local_1f0;
  undefined1 local_1d0 [40];
  ostringstream local_1a8 [376];
  
  iVar1 = compute::(anonymous_namespace)::multiplyComponents<int,3>(&this->m_localSize);
  iVar2 = compute::(anonymous_namespace)::multiplyComponents<int,3>(&this->m_workSize);
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  poVar3 = std::operator<<((ostream *)local_1a8,"#version 310 es\n");
  poVar3 = std::operator<<(poVar3,"layout (local_size_x = ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(this->m_localSize).m_data[0]);
  poVar3 = std::operator<<(poVar3,", local_size_y = ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(this->m_localSize).m_data[1]);
  poVar3 = std::operator<<(poVar3,", local_size_z = ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(this->m_localSize).m_data[2]);
  poVar3 = std::operator<<(poVar3,") in;\n");
  poVar3 = std::operator<<(poVar3,"layout(binding = 0) coherent buffer Output {\n");
  poVar3 = std::operator<<(poVar3,"    uint values[");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2 * iVar1);
  poVar3 = std::operator<<(poVar3,"];\n");
  poVar3 = std::operator<<(poVar3,"} sb_out;\n\n");
  poVar3 = std::operator<<(poVar3,"void main (void) {\n");
  poVar3 = std::operator<<(poVar3,
                           "    uint localSize  = gl_WorkGroupSize.x*gl_WorkGroupSize.y*gl_WorkGroupSize.z;\n"
                          );
  poVar3 = std::operator<<(poVar3,
                           "    uint globalNdx  = gl_NumWorkGroups.x*gl_NumWorkGroups.y*gl_WorkGroupID.z + gl_NumWorkGroups.x*gl_WorkGroupID.y + gl_WorkGroupID.x;\n"
                          );
  poVar3 = std::operator<<(poVar3,"    uint globalOffs = localSize*globalNdx;\n");
  poVar3 = std::operator<<(poVar3,
                           "    uint localOffs  = gl_WorkGroupSize.x*gl_WorkGroupSize.y*gl_LocalInvocationID.z + gl_WorkGroupSize.x*gl_LocalInvocationID.y + gl_LocalInvocationID.x;\n"
                          );
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"    sb_out.values[globalOffs + localOffs] = globalOffs;\n");
  poVar3 = std::operator<<(poVar3,"    memoryBarrierBuffer();\n");
  poVar3 = std::operator<<(poVar3,"    barrier();\n");
  poVar3 = std::operator<<(poVar3,
                           "    sb_out.values[globalOffs + ((localOffs+1u)%localSize)] += localOffs;\n"
                          );
  poVar3 = std::operator<<(poVar3,"    memoryBarrierBuffer();\n");
  poVar3 = std::operator<<(poVar3,"    barrier();\n");
  poVar3 = std::operator<<(poVar3,
                           "    sb_out.values[globalOffs + ((localOffs+2u)%localSize)] += localOffs;\n"
                          );
  std::operator<<(poVar3,"}\n");
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f0,"comp",&local_211);
  this_00 = ::vk::ProgramCollection<glu::ProgramSources>::add
                      (&sourceCollections->glslSources,&local_1f0);
  std::__cxx11::stringbuf::str();
  glu::ComputeSource::ComputeSource((ComputeSource *)local_1d0,&local_210);
  glu::ProgramSources::operator<<(this_00,(ShaderSource *)local_1d0);
  std::__cxx11::string::~string((string *)(local_1d0 + 8));
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  return;
}

Assistant:

void SSBOLocalBarrierTest::initPrograms (SourceCollections& sourceCollections) const
{
	const int workGroupSize = multiplyComponents(m_localSize);
	const int workGroupCount = multiplyComponents(m_workSize);
	const int numValues = workGroupSize * workGroupCount;

	std::ostringstream src;
	src << "#version 310 es\n"
		<< "layout (local_size_x = " << m_localSize.x() << ", local_size_y = " << m_localSize.y() << ", local_size_z = " << m_localSize.z() << ") in;\n"
		<< "layout(binding = 0) coherent buffer Output {\n"
		<< "    uint values[" << numValues << "];\n"
		<< "} sb_out;\n\n"
		<< "void main (void) {\n"
		<< "    uint localSize  = gl_WorkGroupSize.x*gl_WorkGroupSize.y*gl_WorkGroupSize.z;\n"
		<< "    uint globalNdx  = gl_NumWorkGroups.x*gl_NumWorkGroups.y*gl_WorkGroupID.z + gl_NumWorkGroups.x*gl_WorkGroupID.y + gl_WorkGroupID.x;\n"
		<< "    uint globalOffs = localSize*globalNdx;\n"
		<< "    uint localOffs  = gl_WorkGroupSize.x*gl_WorkGroupSize.y*gl_LocalInvocationID.z + gl_WorkGroupSize.x*gl_LocalInvocationID.y + gl_LocalInvocationID.x;\n"
		<< "\n"
		<< "    sb_out.values[globalOffs + localOffs] = globalOffs;\n"
		<< "    memoryBarrierBuffer();\n"
		<< "    barrier();\n"
		<< "    sb_out.values[globalOffs + ((localOffs+1u)%localSize)] += localOffs;\n"		// += so we read and write
		<< "    memoryBarrierBuffer();\n"
		<< "    barrier();\n"
		<< "    sb_out.values[globalOffs + ((localOffs+2u)%localSize)] += localOffs;\n"
		<< "}\n";

	sourceCollections.glslSources.add("comp") << glu::ComputeSource(src.str());
}